

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O0

void adios2::helper::Throw<std::invalid_argument>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  invalid_argument *this;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  LogMode in_R8B;
  string m;
  string local_48 [72];
  
  adios2::helper::MakeMessage(local_48,in_RDI,in_RSI,in_RDX,in_ECX,in_R8B);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,local_48);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Throw(const std::string &component, const std::string &source, const std::string &activity,
           const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw(T(m));
}